

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,BooleanOPNode *booleanOpNode)

{
  int iVar1;
  int iVar2;
  ExpNode *pEVar3;
  TokenNode *pTVar4;
  bool bVar5;
  char *__format;
  
  (booleanOpNode->super_ExpNode).type = 8;
  (booleanOpNode->super_ExpNode).arraySize = -1;
  (booleanOpNode->super_ExpNode).lValue = false;
  (booleanOpNode->super_ExpNode).pointer = false;
  pEVar3 = booleanOpNode->exp1;
  if (pEVar3 == (ExpNode *)0x0) {
    __format = "[SEMANTIC ERROR - booleanOpNode] INVALID EXPRESSION 1, line %d\n";
    goto LAB_0010fa01;
  }
  (*(pEVar3->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar3,this);
  pEVar3 = booleanOpNode->exp2;
  if (pEVar3 == (ExpNode *)0x0) {
    __format = "[SEMANTIC ERROR - booleanOpNode] INVALID EXPRESSION 2, line %d\n";
    goto LAB_0010fa01;
  }
  (*(pEVar3->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar3,this);
  pTVar4 = booleanOpNode->op;
  if (pTVar4 == (TokenNode *)0x0) {
    __format = "[SEMANTIC ERROR - booleanOpNode] INVALID OPERATOR, line %d\n";
    goto LAB_0010fa01;
  }
  (*(pTVar4->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar4,this);
  pEVar3 = booleanOpNode->exp1;
  bVar5 = _match_exp_types(pEVar3,booleanOpNode->exp2);
  if (!bVar5) {
    __format = "[SEMANTIC ERROR - booleanOpNode] CANNOT COMPARE DIFFERENT TYPES, line %d\n";
    goto LAB_0010fa01;
  }
  iVar1 = pEVar3->type;
  iVar2 = pEVar3->arraySize;
  if (5 < booleanOpNode->op->token - 1U) {
    __format = "[SEMANTIC ERROR - booleanOpNode] CANNOT COMPARE WITH NON BOOLEAN TYPES, line %d\n";
    if (((iVar2 < 0) && (iVar1 == 8)) && (pEVar3->pointer == false)) {
      return;
    }
    goto LAB_0010fa01;
  }
  if (iVar1 == 0xb) {
    if (iVar2 < 0) goto LAB_0010f9c7;
  }
  else {
    __format = "[SEMANTIC ERROR - booleanOpNode] CANNOT COMPARE WITH NON NUMERIC TYPES, line %d\n";
    if ((-1 < iVar2) || (iVar1 != 0xc)) goto LAB_0010fa01;
LAB_0010f9c7:
    if (pEVar3->pointer != true) {
      return;
    }
  }
  __format = "[SEMANTIC ERROR - booleanOpNode] CANNOT COMPARE WITH NON NUMERIC TYPES, line %d\n";
LAB_0010fa01:
  fprintf(_stderr,__format,
          (ulong)(uint)(booleanOpNode->super_ExpNode).super_StmtNode.super_ASTNode.line);
  return;
}

Assistant:

void SemanticTypes::visit(BooleanOPNode *booleanOpNode) {

    booleanOpNode->setType(BOOL);
    booleanOpNode->setLValue(false);
    booleanOpNode->setPointer(false);
    booleanOpNode->setArraySize(-1);

    if (booleanOpNode->getExp1()) {
        booleanOpNode->getExp1()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] INVALID EXPRESSION 1, line %d\n", booleanOpNode->getLine());
        return;
    }

    if (booleanOpNode->getExp2()) {
        booleanOpNode->getExp2()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] INVALID EXPRESSION 2, line %d\n", booleanOpNode->getLine());
        return;
    }

    if (booleanOpNode->getOp()) {
        booleanOpNode->getOp()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] INVALID OPERATOR, line %d\n", booleanOpNode->getLine());
        return;
    }

    if (!_match_exp_types(booleanOpNode->getExp1(), booleanOpNode->getExp2())) {
        fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] CANNOT COMPARE DIFFERENT TYPES, line %d\n",
                booleanOpNode->getLine());
        return;
    }

    bool isArray = booleanOpNode->getExp1()->getArraySize() > -1;
    if (booleanOpNode->getOp()->getToken() != NE && booleanOpNode->getOp()->getToken() != EQ && booleanOpNode->getOp()
        && booleanOpNode->getOp()->getToken() != LT && booleanOpNode->getOp()->getToken() != LE && booleanOpNode->getOp()->getToken() != GE
            && booleanOpNode->getOp()->getToken() != GT)
    { //Pode sendo igual
    
        if(booleanOpNode->getExp1()->getType() != BOOL ||isArray || booleanOpNode->getExp1()->isPointer()) {
            fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] CANNOT COMPARE WITH NON BOOLEAN TYPES, line %d\n",
                    booleanOpNode->getLine());
            return;
        }
    } else {
        if ((booleanOpNode->getExp1()->getType() != INT && booleanOpNode->getExp1()->getType() != FLOAT) || isArray ||
            booleanOpNode->getExp1()->isPointer()) {
            fprintf(stderr, "[SEMANTIC ERROR - booleanOpNode] CANNOT COMPARE WITH NON NUMERIC TYPES, line %d\n",
                    booleanOpNode->getLine());
            return;
        }
    }
}